

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.h
# Opt level: O3

void __thiscall
HighsSparseMatrix::HighsSparseMatrix(HighsSparseMatrix *this,HighsSparseMatrix *param_1)

{
  HighsInt HVar1;
  
  this->num_row_ = param_1->num_row_;
  HVar1 = param_1->num_col_;
  this->format_ = param_1->format_;
  this->num_col_ = HVar1;
  std::vector<int,_std::allocator<int>_>::vector(&this->start_,&param_1->start_);
  std::vector<int,_std::allocator<int>_>::vector(&this->p_end_,&param_1->p_end_);
  std::vector<int,_std::allocator<int>_>::vector(&this->index_,&param_1->index_);
  std::vector<double,_std::allocator<double>_>::vector(&this->value_,&param_1->value_);
  return;
}

Assistant:

HighsSparseMatrix() { clear(); }